

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

void ReadFile(string *fileName,vector<int,_std::allocator<int>_> *retVector)

{
  iterator __position;
  char cVar1;
  int iVar2;
  uint uVar3;
  char inChar;
  ifstream input;
  char local_22d;
  uint local_22c;
  char local_228 [520];
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open(local_228,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      iVar2 = std::istream::peek();
      if (iVar2 == -1) break;
      std::istream::get(local_228);
      uVar3 = (int)local_22d - 0x30;
      if (uVar3 < 10) {
        __position._M_current =
             (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_22c = uVar3;
        if (__position._M_current ==
            (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (retVector,__position,(int *)&local_22c);
        }
        else {
          *__position._M_current = uVar3;
          (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
          ._M_finish = __position._M_current + 1;
        }
      }
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void ReadFile(std::string fileName, std::vector<int> *retVector)
{
    std::ifstream input;


    input.open(fileName.c_str());

    if(input.is_open())
    {
        while(input.peek() != EOF)
        {
            char inChar;
            input.get(inChar);

            if(isdigit(inChar))
            {
                retVector->push_back(inChar - 48);
            }
        }
    }

    input.close();
}